

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O2

TIFFReadDirEntryErr
TIFFReadDirEntryDataAndRealloc(TIFF *tif,uint64_t offset,tmsize_t size,void **pdest)

{
  int iVar1;
  void *pvVar2;
  tmsize_t tVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  if ((tif->tif_flags & 0x800) != 0) {
    __assert_fail("!isMapped(tif)",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_dirread.c"
                  ,0x4c0,
                  "enum TIFFReadDirEntryErr TIFFReadDirEntryDataAndRealloc(TIFF *, uint64_t, tmsize_t, void **)"
                 );
  }
  iVar1 = _TIFFSeekOK(tif,offset);
  if (iVar1 != 0) {
    lVar4 = 0x100000;
    lVar7 = 0;
    do {
      lVar5 = size - lVar7;
      if (lVar5 == 0 || size < lVar7) {
        return TIFFReadDirEntryErrOk;
      }
      lVar6 = lVar5;
      if (lVar4 < 0x3e800000 && lVar4 <= lVar5) {
        lVar6 = lVar4;
      }
      pvVar2 = _TIFFreallocExt(tif,*pdest,lVar6 + lVar7);
      if (pvVar2 == (void *)0x0) {
        TIFFErrorExtR(tif,tif->tif_name,
                      "Failed to allocate memory for %s (%ld elements of %ld bytes each)",
                      "TIFFReadDirEntryArray",1,lVar6 + lVar7);
        return TIFFReadDirEntryErrAlloc;
      }
      if (lVar4 < 0x3e800000 && lVar4 <= lVar5) {
        lVar4 = lVar4 * 10;
      }
      *pdest = pvVar2;
      tVar3 = (*tif->tif_readproc)(tif->tif_clientdata,(void *)((long)pvVar2 + lVar7),lVar6);
      lVar7 = lVar7 + tVar3;
    } while (tVar3 == lVar6);
  }
  return TIFFReadDirEntryErrIo;
}

Assistant:

static enum TIFFReadDirEntryErr TIFFReadDirEntryDataAndRealloc(TIFF *tif,
                                                               uint64_t offset,
                                                               tmsize_t size,
                                                               void **pdest)
{
#if SIZEOF_SIZE_T == 8
    tmsize_t threshold = INITIAL_THRESHOLD;
#endif
    tmsize_t already_read = 0;

    assert(!isMapped(tif));

    if (!SeekOK(tif, offset))
        return (TIFFReadDirEntryErrIo);

    /* On 64 bit processes, read first a maximum of 1 MB, then 10 MB, etc */
    /* so as to avoid allocating too much memory in case the file is too */
    /* short. We could ask for the file size, but this might be */
    /* expensive with some I/O layers (think of reading a gzipped file) */
    /* Restrict to 64 bit processes, so as to avoid reallocs() */
    /* on 32 bit processes where virtual memory is scarce.  */
    while (already_read < size)
    {
        void *new_dest;
        tmsize_t bytes_read;
        tmsize_t to_read = size - already_read;
#if SIZEOF_SIZE_T == 8
        if (to_read >= threshold && threshold < MAX_THRESHOLD)
        {
            to_read = threshold;
            threshold *= THRESHOLD_MULTIPLIER;
        }
#endif

        new_dest =
            (uint8_t *)_TIFFreallocExt(tif, *pdest, already_read + to_read);
        if (new_dest == NULL)
        {
            TIFFErrorExtR(tif, tif->tif_name,
                          "Failed to allocate memory for %s "
                          "(%" TIFF_SSIZE_FORMAT
                          " elements of %" TIFF_SSIZE_FORMAT " bytes each)",
                          "TIFFReadDirEntryArray", (tmsize_t)1,
                          already_read + to_read);
            return TIFFReadDirEntryErrAlloc;
        }
        *pdest = new_dest;

        bytes_read = TIFFReadFile(tif, (char *)*pdest + already_read, to_read);
        already_read += bytes_read;
        if (bytes_read != to_read)
        {
            return TIFFReadDirEntryErrIo;
        }
    }
    return TIFFReadDirEntryErrOk;
}